

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  long lVar3;
  RTCIntersectArguments *pRVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined1 (*pauVar44) [16];
  ulong uVar45;
  int *piVar46;
  RTCRayQueryContext *pRVar47;
  ulong uVar48;
  ulong uVar49;
  undefined1 (*pauVar50) [16];
  uint uVar51;
  long lVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 (*pauVar58) [16];
  ulong uVar59;
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar66 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [32];
  float fVar102;
  undefined1 auVar101 [64];
  uint uVar104;
  uint uVar105;
  uint uVar106;
  undefined1 auVar103 [64];
  undefined1 auVar107 [64];
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar109 [64];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2640 [8];
  undefined8 uStack_2638;
  int local_2614;
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  RTCFilterFunctionNArguments local_25c0;
  undefined1 local_2590 [16];
  undefined4 local_2580;
  undefined4 local_257c;
  undefined4 local_2578;
  float local_2574;
  float local_2570;
  undefined4 local_256c;
  uint local_2568;
  uint local_2564;
  uint local_2560;
  undefined8 local_2550;
  undefined8 uStack_2548;
  undefined1 local_2540 [32];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_24f0 [16];
  float local_24e0 [4];
  float local_24d0 [4];
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar44 = (undefined1 (*) [16])local_2390;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar70 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar81 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar90._8_4_ = 0x7fffffff;
    auVar90._0_8_ = 0x7fffffff7fffffff;
    auVar90._12_4_ = 0x7fffffff;
    auVar90 = vandps_avx((undefined1  [16])aVar2,auVar90);
    auVar93._8_4_ = 0x219392ef;
    auVar93._0_8_ = 0x219392ef219392ef;
    auVar93._12_4_ = 0x219392ef;
    auVar90 = vcmpps_avx(auVar90,auVar93,1);
    auVar90 = vblendvps_avx((undefined1  [16])aVar2,auVar93,auVar90);
    uStack_2398 = 0;
    auVar93 = vrcpps_avx(auVar90);
    fVar60 = auVar93._0_4_;
    auVar87._0_4_ = auVar90._0_4_ * fVar60;
    fVar67 = auVar93._4_4_;
    auVar87._4_4_ = auVar90._4_4_ * fVar67;
    fVar68 = auVar93._8_4_;
    auVar87._8_4_ = auVar90._8_4_ * fVar68;
    fVar69 = auVar93._12_4_;
    auVar87._12_4_ = auVar90._12_4_ * fVar69;
    auVar94._8_4_ = 0x3f800000;
    auVar94._0_8_ = 0x3f8000003f800000;
    auVar94._12_4_ = 0x3f800000;
    auVar90 = vsubps_avx(auVar94,auVar87);
    uVar43 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar43;
    local_23c0._0_4_ = uVar43;
    local_23c0._8_4_ = uVar43;
    local_23c0._12_4_ = uVar43;
    local_23c0._16_4_ = uVar43;
    local_23c0._20_4_ = uVar43;
    local_23c0._24_4_ = uVar43;
    local_23c0._28_4_ = uVar43;
    auVar96 = ZEXT3264(local_23c0);
    uVar43 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar43;
    local_23e0._0_4_ = uVar43;
    local_23e0._8_4_ = uVar43;
    local_23e0._12_4_ = uVar43;
    local_23e0._16_4_ = uVar43;
    local_23e0._20_4_ = uVar43;
    local_23e0._24_4_ = uVar43;
    local_23e0._28_4_ = uVar43;
    auVar99 = ZEXT3264(local_23e0);
    uVar43 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar43;
    local_2400._0_4_ = uVar43;
    local_2400._8_4_ = uVar43;
    local_2400._12_4_ = uVar43;
    local_2400._16_4_ = uVar43;
    local_2400._20_4_ = uVar43;
    local_2400._24_4_ = uVar43;
    local_2400._28_4_ = uVar43;
    auVar101 = ZEXT3264(local_2400);
    auVar88._0_4_ = fVar60 + fVar60 * auVar90._0_4_;
    auVar88._4_4_ = fVar67 + fVar67 * auVar90._4_4_;
    auVar88._8_4_ = fVar68 + fVar68 * auVar90._8_4_;
    auVar88._12_4_ = fVar69 + fVar69 * auVar90._12_4_;
    auVar90 = vshufps_avx(auVar88,auVar88,0);
    local_2420._16_16_ = auVar90;
    local_2420._0_16_ = auVar90;
    auVar103 = ZEXT3264(local_2420);
    auVar90 = vmovshdup_avx(auVar88);
    auVar93 = vshufps_avx(auVar88,auVar88,0x55);
    local_2440._16_16_ = auVar93;
    local_2440._0_16_ = auVar93;
    auVar107 = ZEXT3264(local_2440);
    auVar93 = vshufpd_avx(auVar88,auVar88,1);
    auVar87 = vshufps_avx(auVar88,auVar88,0xaa);
    uVar55 = (ulong)(auVar88._0_4_ < 0.0) << 5;
    local_2460._16_16_ = auVar87;
    local_2460._0_16_ = auVar87;
    auVar109 = ZEXT3264(local_2460);
    uVar48 = (ulong)(auVar90._0_4_ < 0.0) << 5 | 0x40;
    uVar56 = (ulong)(auVar93._0_4_ < 0.0) << 5 | 0x80;
    uVar57 = uVar55 ^ 0x20;
    auVar90 = vshufps_avx(auVar70,auVar70,0);
    local_2480._16_16_ = auVar90;
    local_2480._0_16_ = auVar90;
    auVar117 = ZEXT3264(local_2480);
    auVar90 = vshufps_avx(auVar81,auVar81,0);
    auVar66 = ZEXT3264(CONCAT1616(auVar90,auVar90));
    local_2550 = mm_lookupmask_ps._240_8_;
    uStack_2548 = mm_lookupmask_ps._248_8_;
LAB_014c70e1:
    do {
      pauVar58 = pauVar44 + -1;
      pauVar44 = pauVar44 + -1;
      if (*(float *)(*pauVar58 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar49 = *(ulong *)*pauVar44;
        while ((uVar49 & 8) == 0) {
          auVar95 = auVar96._0_32_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar55),auVar95);
          auVar16._4_4_ = auVar103._4_4_ * auVar15._4_4_;
          auVar16._0_4_ = auVar103._0_4_ * auVar15._0_4_;
          auVar16._8_4_ = auVar103._8_4_ * auVar15._8_4_;
          auVar16._12_4_ = auVar103._12_4_ * auVar15._12_4_;
          auVar16._16_4_ = auVar103._16_4_ * auVar15._16_4_;
          auVar16._20_4_ = auVar103._20_4_ * auVar15._20_4_;
          auVar16._24_4_ = auVar103._24_4_ * auVar15._24_4_;
          auVar16._28_4_ = auVar15._28_4_;
          auVar98 = auVar99._0_32_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar48),auVar98);
          auVar100._4_4_ = auVar107._4_4_ * auVar15._4_4_;
          auVar100._0_4_ = auVar107._0_4_ * auVar15._0_4_;
          auVar100._8_4_ = auVar107._8_4_ * auVar15._8_4_;
          auVar100._12_4_ = auVar107._12_4_ * auVar15._12_4_;
          auVar100._16_4_ = auVar107._16_4_ * auVar15._16_4_;
          auVar100._20_4_ = auVar107._20_4_ * auVar15._20_4_;
          auVar100._24_4_ = auVar107._24_4_ * auVar15._24_4_;
          auVar100._28_4_ = auVar15._28_4_;
          auVar15 = vmaxps_avx(auVar16,auVar100);
          auVar100 = auVar101._0_32_;
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar56),auVar100);
          auVar18._4_4_ = auVar109._4_4_ * auVar16._4_4_;
          auVar18._0_4_ = auVar109._0_4_ * auVar16._0_4_;
          auVar18._8_4_ = auVar109._8_4_ * auVar16._8_4_;
          auVar18._12_4_ = auVar109._12_4_ * auVar16._12_4_;
          auVar18._16_4_ = auVar109._16_4_ * auVar16._16_4_;
          auVar18._20_4_ = auVar109._20_4_ * auVar16._20_4_;
          auVar18._24_4_ = auVar109._24_4_ * auVar16._24_4_;
          auVar18._28_4_ = auVar16._28_4_;
          auVar16 = vmaxps_avx(auVar18,auVar117._0_32_);
          local_2540 = vmaxps_avx(auVar15,auVar16);
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + uVar57),auVar95);
          auVar19._4_4_ = auVar103._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = auVar103._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = auVar103._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar103._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = auVar103._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = auVar103._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = auVar103._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          auVar15 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar48 ^ 0x20)),auVar98);
          auVar20._4_4_ = auVar107._4_4_ * auVar15._4_4_;
          auVar20._0_4_ = auVar107._0_4_ * auVar15._0_4_;
          auVar20._8_4_ = auVar107._8_4_ * auVar15._8_4_;
          auVar20._12_4_ = auVar107._12_4_ * auVar15._12_4_;
          auVar20._16_4_ = auVar107._16_4_ * auVar15._16_4_;
          auVar20._20_4_ = auVar107._20_4_ * auVar15._20_4_;
          auVar20._24_4_ = auVar107._24_4_ * auVar15._24_4_;
          auVar20._28_4_ = auVar15._28_4_;
          auVar15 = vminps_avx(auVar19,auVar20);
          auVar16 = vsubps_avx(*(undefined1 (*) [32])(uVar49 + 0x40 + (uVar56 ^ 0x20)),auVar100);
          auVar21._4_4_ = auVar109._4_4_ * auVar16._4_4_;
          auVar21._0_4_ = auVar109._0_4_ * auVar16._0_4_;
          auVar21._8_4_ = auVar109._8_4_ * auVar16._8_4_;
          auVar21._12_4_ = auVar109._12_4_ * auVar16._12_4_;
          auVar21._16_4_ = auVar109._16_4_ * auVar16._16_4_;
          auVar21._20_4_ = auVar109._20_4_ * auVar16._20_4_;
          auVar21._24_4_ = auVar109._24_4_ * auVar16._24_4_;
          auVar21._28_4_ = auVar16._28_4_;
          auVar16 = vminps_avx(auVar21,auVar66._0_32_);
          auVar15 = vminps_avx(auVar15,auVar16);
          auVar15 = vcmpps_avx(local_2540,auVar15,2);
          uVar51 = vmovmskps_avx(auVar15);
          if (uVar51 == 0) {
            if (pauVar44 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014c70e1;
          }
          uVar51 = uVar51 & 0xff;
          uVar45 = uVar49 & 0xfffffffffffffff0;
          lVar54 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          uVar49 = *(ulong *)(uVar45 + lVar54 * 8);
          uVar51 = uVar51 - 1 & uVar51;
          if (uVar51 != 0) {
            uVar104 = *(uint *)(local_2540 + lVar54 * 4);
            lVar54 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            uVar59 = *(ulong *)(uVar45 + lVar54 * 8);
            uVar105 = *(uint *)(local_2540 + lVar54 * 4);
            uVar51 = uVar51 - 1 & uVar51;
            if (uVar51 == 0) {
              if (uVar104 < uVar105) {
                *(ulong *)*pauVar44 = uVar59;
                *(uint *)(*pauVar44 + 8) = uVar105;
                pauVar44 = pauVar44 + 1;
              }
              else {
                *(ulong *)*pauVar44 = uVar49;
                *(uint *)(*pauVar44 + 8) = uVar104;
                pauVar44 = pauVar44 + 1;
                uVar49 = uVar59;
              }
            }
            else {
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar49;
              auVar90 = vpunpcklqdq_avx(auVar70,ZEXT416(uVar104));
              auVar81._8_8_ = 0;
              auVar81._0_8_ = uVar59;
              auVar70 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar105));
              lVar54 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                }
              }
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(uVar45 + lVar54 * 8);
              auVar81 = vpunpcklqdq_avx(auVar89,ZEXT416(*(uint *)(local_2540 + lVar54 * 4)));
              uVar51 = uVar51 - 1 & uVar51;
              if (uVar51 == 0) {
                auVar93 = vpcmpgtd_avx(auVar70,auVar90);
                auVar87 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar70,auVar90,auVar87);
                auVar90 = vblendvps_avx(auVar90,auVar70,auVar87);
                auVar70 = vpcmpgtd_avx(auVar81,auVar93);
                auVar87 = vpshufd_avx(auVar70,0xaa);
                auVar70 = vblendvps_avx(auVar81,auVar93,auVar87);
                auVar81 = vblendvps_avx(auVar93,auVar81,auVar87);
                auVar93 = vpcmpgtd_avx(auVar81,auVar90);
                auVar87 = vpshufd_avx(auVar93,0xaa);
                auVar93 = vblendvps_avx(auVar81,auVar90,auVar87);
                auVar90 = vblendvps_avx(auVar90,auVar81,auVar87);
                *pauVar44 = auVar90;
                pauVar44[1] = auVar93;
                uVar49 = auVar70._0_8_;
                pauVar44 = pauVar44 + 2;
              }
              else {
                lVar54 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                  }
                }
                auVar91._8_8_ = 0;
                auVar91._0_8_ = *(ulong *)(uVar45 + lVar54 * 8);
                auVar93 = vpunpcklqdq_avx(auVar91,ZEXT416(*(uint *)(local_2540 + lVar54 * 4)));
                uVar51 = uVar51 - 1 & uVar51;
                uVar59 = (ulong)uVar51;
                if (uVar51 == 0) {
                  auVar87 = vpcmpgtd_avx(auVar70,auVar90);
                  auVar88 = vpshufd_avx(auVar87,0xaa);
                  auVar87 = vblendvps_avx(auVar70,auVar90,auVar88);
                  auVar90 = vblendvps_avx(auVar90,auVar70,auVar88);
                  auVar70 = vpcmpgtd_avx(auVar93,auVar81);
                  auVar88 = vpshufd_avx(auVar70,0xaa);
                  auVar70 = vblendvps_avx(auVar93,auVar81,auVar88);
                  auVar81 = vblendvps_avx(auVar81,auVar93,auVar88);
                  auVar93 = vpcmpgtd_avx(auVar81,auVar90);
                  auVar88 = vpshufd_avx(auVar93,0xaa);
                  auVar93 = vblendvps_avx(auVar81,auVar90,auVar88);
                  auVar90 = vblendvps_avx(auVar90,auVar81,auVar88);
                  auVar81 = vpcmpgtd_avx(auVar70,auVar87);
                  auVar88 = vpshufd_avx(auVar81,0xaa);
                  auVar81 = vblendvps_avx(auVar70,auVar87,auVar88);
                  auVar70 = vblendvps_avx(auVar87,auVar70,auVar88);
                  auVar87 = vpcmpgtd_avx(auVar93,auVar70);
                  auVar88 = vpshufd_avx(auVar87,0xaa);
                  auVar87 = vblendvps_avx(auVar93,auVar70,auVar88);
                  auVar70 = vblendvps_avx(auVar70,auVar93,auVar88);
                  *pauVar44 = auVar90;
                  pauVar44[1] = auVar70;
                  pauVar44[2] = auVar87;
                  uVar49 = auVar81._0_8_;
                  pauVar58 = pauVar44 + 3;
                }
                else {
                  *pauVar44 = auVar90;
                  pauVar44[1] = auVar70;
                  pauVar44[2] = auVar81;
                  pauVar44[3] = auVar93;
                  lVar54 = 0x30;
                  do {
                    lVar52 = lVar54;
                    lVar54 = 0;
                    if (uVar59 != 0) {
                      for (; (uVar59 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                      }
                    }
                    uVar49 = *(ulong *)(uVar45 + lVar54 * 8);
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar49;
                    auVar90 = vpunpcklqdq_avx(auVar71,ZEXT416(*(uint *)(local_2540 + lVar54 * 4)));
                    *(undefined1 (*) [16])(pauVar44[1] + lVar52) = auVar90;
                    uVar59 = uVar59 & uVar59 - 1;
                    lVar54 = lVar52 + 0x10;
                  } while (uVar59 != 0);
                  pauVar58 = (undefined1 (*) [16])(pauVar44[1] + lVar52);
                  if (lVar52 + 0x10 != 0) {
                    lVar54 = 0x10;
                    pauVar53 = pauVar44;
                    do {
                      auVar90 = pauVar53[1];
                      pauVar53 = pauVar53 + 1;
                      uVar51 = vextractps_avx(auVar90,2);
                      lVar52 = lVar54;
                      do {
                        if (uVar51 <= *(uint *)(pauVar44[-1] + lVar52 + 8)) {
                          pauVar50 = (undefined1 (*) [16])(*pauVar44 + lVar52);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar44 + lVar52) =
                             *(undefined1 (*) [16])(pauVar44[-1] + lVar52);
                        lVar52 = lVar52 + -0x10;
                        pauVar50 = pauVar44;
                      } while (lVar52 != 0);
                      *pauVar50 = auVar90;
                      lVar54 = lVar54 + 0x10;
                    } while (pauVar58 != pauVar53);
                    uVar49 = *(ulong *)*pauVar58;
                  }
                }
                auVar96 = ZEXT3264(auVar95);
                auVar99 = ZEXT3264(auVar98);
                auVar101 = ZEXT3264(auVar100);
                auVar103 = ZEXT3264(auVar103._0_32_);
                auVar107 = ZEXT3264(auVar107._0_32_);
                auVar109 = ZEXT3264(auVar109._0_32_);
                auVar117 = ZEXT3264(auVar117._0_32_);
                pauVar44 = pauVar58;
              }
            }
          }
        }
        uVar45 = (ulong)((uint)uVar49 & 0xf);
        if (uVar45 != 8) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          lVar54 = 0;
          do {
            lVar52 = lVar54 * 0xb0;
            pfVar1 = (float *)(uVar49 + 0x80 + lVar52);
            fVar22 = *pfVar1;
            fVar23 = pfVar1[1];
            fVar24 = pfVar1[2];
            fVar25 = pfVar1[3];
            pfVar1 = (float *)(uVar49 + 0x40 + lVar52);
            fVar26 = *pfVar1;
            fVar27 = pfVar1[1];
            fVar28 = pfVar1[2];
            fVar29 = pfVar1[3];
            auVar61._0_4_ = fVar22 * fVar26;
            auVar61._4_4_ = fVar23 * fVar27;
            auVar61._8_4_ = fVar24 * fVar28;
            auVar61._12_4_ = fVar25 * fVar29;
            pfVar1 = (float *)(uVar49 + 0x70 + lVar52);
            fVar30 = *pfVar1;
            fVar31 = pfVar1[1];
            fVar32 = pfVar1[2];
            fVar33 = pfVar1[3];
            pfVar1 = (float *)(uVar49 + 0x50 + lVar52);
            fVar34 = *pfVar1;
            fVar35 = pfVar1[1];
            fVar36 = pfVar1[2];
            fVar37 = pfVar1[3];
            auVar72._0_4_ = fVar30 * fVar34;
            auVar72._4_4_ = fVar31 * fVar35;
            auVar72._8_4_ = fVar32 * fVar36;
            auVar72._12_4_ = fVar33 * fVar37;
            local_2600 = vsubps_avx(auVar72,auVar61);
            auVar90 = *(undefined1 (*) [16])(uVar49 + 0x60 + lVar52);
            fVar108 = auVar90._0_4_;
            auVar73._0_4_ = fVar108 * fVar34;
            fVar110 = auVar90._4_4_;
            auVar73._4_4_ = fVar110 * fVar35;
            fVar111 = auVar90._8_4_;
            auVar73._8_4_ = fVar111 * fVar36;
            fVar112 = auVar90._12_4_;
            auVar73._12_4_ = fVar112 * fVar37;
            pfVar1 = (float *)(uVar49 + 0x30 + lVar52);
            fVar38 = *pfVar1;
            fVar39 = pfVar1[1];
            fVar40 = pfVar1[2];
            fVar41 = pfVar1[3];
            auVar82._0_4_ = fVar22 * fVar38;
            auVar82._4_4_ = fVar23 * fVar39;
            auVar82._8_4_ = fVar24 * fVar40;
            auVar82._12_4_ = fVar25 * fVar41;
            auVar81 = vsubps_avx(auVar82,auVar73);
            auVar83._0_4_ = fVar30 * fVar38;
            auVar83._4_4_ = fVar31 * fVar39;
            auVar83._8_4_ = fVar32 * fVar40;
            auVar83._12_4_ = fVar33 * fVar41;
            auVar113._0_4_ = fVar108 * fVar26;
            auVar113._4_4_ = fVar110 * fVar27;
            auVar113._8_4_ = fVar111 * fVar28;
            auVar113._12_4_ = fVar112 * fVar29;
            auVar93 = vsubps_avx(auVar113,auVar83);
            uVar43 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar114._4_4_ = uVar43;
            auVar114._0_4_ = uVar43;
            auVar114._8_4_ = uVar43;
            auVar114._12_4_ = uVar43;
            local_2590 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + lVar52),auVar114);
            uVar43 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar115._4_4_ = uVar43;
            auVar115._0_4_ = uVar43;
            auVar115._8_4_ = uVar43;
            auVar115._12_4_ = uVar43;
            auVar90 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x10 + lVar52),auVar115);
            uVar43 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar116._4_4_ = uVar43;
            auVar116._0_4_ = uVar43;
            auVar116._8_4_ = uVar43;
            auVar116._12_4_ = uVar43;
            local_2610 = vsubps_avx(*(undefined1 (*) [16])(uVar49 + 0x20 + lVar52),auVar116);
            fVar60 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar67 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar69 = local_2610._0_4_;
            auVar118._0_4_ = fVar60 * fVar69;
            fVar6 = local_2610._4_4_;
            auVar118._4_4_ = fVar60 * fVar6;
            fVar9 = local_2610._8_4_;
            auVar118._8_4_ = fVar60 * fVar9;
            fVar12 = local_2610._12_4_;
            auVar118._12_4_ = fVar60 * fVar12;
            fVar102 = auVar90._0_4_;
            auVar119._0_4_ = fVar67 * fVar102;
            fVar7 = auVar90._4_4_;
            auVar119._4_4_ = fVar67 * fVar7;
            fVar10 = auVar90._8_4_;
            auVar119._8_4_ = fVar67 * fVar10;
            fVar13 = auVar90._12_4_;
            auVar119._12_4_ = fVar67 * fVar13;
            auVar70 = vsubps_avx(auVar119,auVar118);
            fVar68 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar5 = local_2590._0_4_;
            auVar62._0_4_ = fVar67 * fVar5;
            fVar8 = local_2590._4_4_;
            auVar62._4_4_ = fVar67 * fVar8;
            fVar11 = local_2590._8_4_;
            auVar62._8_4_ = fVar67 * fVar11;
            fVar14 = local_2590._12_4_;
            auVar62._12_4_ = fVar67 * fVar14;
            auVar74._0_4_ = fVar68 * fVar69;
            auVar74._4_4_ = fVar68 * fVar6;
            auVar74._8_4_ = fVar68 * fVar9;
            auVar74._12_4_ = fVar68 * fVar12;
            auVar87 = vsubps_avx(auVar74,auVar62);
            auVar75._0_4_ = fVar68 * fVar102;
            auVar75._4_4_ = fVar68 * fVar7;
            auVar75._8_4_ = fVar68 * fVar10;
            auVar75._12_4_ = fVar68 * fVar13;
            auVar84._0_4_ = fVar60 * fVar5;
            auVar84._4_4_ = fVar60 * fVar8;
            auVar84._8_4_ = fVar60 * fVar11;
            auVar84._12_4_ = fVar60 * fVar14;
            auVar88 = vsubps_avx(auVar84,auVar75);
            auVar85._0_4_ =
                 local_2600._0_4_ * fVar68 + fVar60 * auVar81._0_4_ + fVar67 * auVar93._0_4_;
            auVar85._4_4_ =
                 local_2600._4_4_ * fVar68 + fVar60 * auVar81._4_4_ + fVar67 * auVar93._4_4_;
            auVar85._8_4_ =
                 local_2600._8_4_ * fVar68 + fVar60 * auVar81._8_4_ + fVar67 * auVar93._8_4_;
            auVar85._12_4_ =
                 local_2600._12_4_ * fVar68 + fVar60 * auVar81._12_4_ + fVar67 * auVar93._12_4_;
            auVar76._8_8_ = 0x8000000080000000;
            auVar76._0_8_ = 0x8000000080000000;
            auVar90 = vandps_avx(auVar85,auVar76);
            uVar51 = auVar90._0_4_;
            local_2540._0_4_ =
                 (float)(uVar51 ^ (uint)(fVar108 * auVar70._0_4_ +
                                        fVar22 * auVar88._0_4_ + fVar30 * auVar87._0_4_));
            uVar104 = auVar90._4_4_;
            local_2540._4_4_ =
                 (float)(uVar104 ^
                        (uint)(fVar110 * auVar70._4_4_ +
                              fVar23 * auVar88._4_4_ + fVar31 * auVar87._4_4_));
            uVar105 = auVar90._8_4_;
            local_2540._8_4_ =
                 (float)(uVar105 ^
                        (uint)(fVar111 * auVar70._8_4_ +
                              fVar24 * auVar88._8_4_ + fVar32 * auVar87._8_4_));
            uVar106 = auVar90._12_4_;
            local_2540._12_4_ =
                 (float)(uVar106 ^
                        (uint)(fVar112 * auVar70._12_4_ +
                              fVar25 * auVar88._12_4_ + fVar33 * auVar87._12_4_));
            local_2540._16_4_ =
                 (float)(uVar51 ^ (uint)(fVar38 * auVar70._0_4_ +
                                        fVar34 * auVar88._0_4_ + fVar26 * auVar87._0_4_));
            local_2540._20_4_ =
                 (float)(uVar104 ^
                        (uint)(fVar39 * auVar70._4_4_ +
                              fVar35 * auVar88._4_4_ + fVar27 * auVar87._4_4_));
            local_2540._24_4_ =
                 (float)(uVar105 ^
                        (uint)(fVar40 * auVar70._8_4_ +
                              fVar36 * auVar88._8_4_ + fVar28 * auVar87._8_4_));
            local_2540._28_4_ =
                 (float)(uVar106 ^
                        (uint)(fVar41 * auVar70._12_4_ +
                              fVar37 * auVar88._12_4_ + fVar29 * auVar87._12_4_));
            auVar87 = ZEXT416(0) << 0x20;
            auVar90 = vcmpps_avx(local_2540._0_16_,auVar87,5);
            auVar70 = vcmpps_avx(local_2540._16_16_,auVar87,5);
            auVar90 = vandps_avx(auVar90,auVar70);
            auVar77._8_4_ = 0x7fffffff;
            auVar77._0_8_ = 0x7fffffff7fffffff;
            auVar77._12_4_ = 0x7fffffff;
            local_2510 = vandps_avx(auVar85,auVar77);
            auVar70 = vcmpps_avx(auVar87,auVar85,4);
            auVar90 = vandps_avx(auVar90,auVar70);
            auVar78._0_4_ = local_2540._0_4_ + local_2540._16_4_;
            auVar78._4_4_ = local_2540._4_4_ + local_2540._20_4_;
            auVar78._8_4_ = local_2540._8_4_ + local_2540._24_4_;
            auVar78._12_4_ = local_2540._12_4_ + local_2540._28_4_;
            auVar70 = vcmpps_avx(auVar78,local_2510,2);
            auVar90 = vandps_avx(auVar90,auVar70);
            auVar17._8_8_ = uStack_2548;
            auVar17._0_8_ = local_2550;
            auVar17 = auVar17 & auVar90;
            if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar17[0xf] < '\0') {
              auVar42._8_8_ = uStack_2548;
              auVar42._0_8_ = local_2550;
              auVar90 = vandps_avx(auVar90,auVar42);
              local_2520._0_4_ =
                   (float)(uVar51 ^ (uint)(local_2600._0_4_ * fVar5 +
                                          fVar102 * auVar81._0_4_ + fVar69 * auVar93._0_4_));
              local_2520._4_4_ =
                   (float)(uVar104 ^
                          (uint)(local_2600._4_4_ * fVar8 +
                                fVar7 * auVar81._4_4_ + fVar6 * auVar93._4_4_));
              local_2520._8_4_ =
                   (float)(uVar105 ^
                          (uint)(local_2600._8_4_ * fVar11 +
                                fVar10 * auVar81._8_4_ + fVar9 * auVar93._8_4_));
              local_2520._12_4_ =
                   (float)(uVar106 ^
                          (uint)(local_2600._12_4_ * fVar14 +
                                fVar13 * auVar81._12_4_ + fVar12 * auVar93._12_4_));
              fVar60 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar67 = local_2510._0_4_;
              auVar63._0_4_ = fVar67 * fVar60;
              fVar68 = local_2510._4_4_;
              auVar63._4_4_ = fVar68 * fVar60;
              fVar69 = local_2510._8_4_;
              auVar63._8_4_ = fVar69 * fVar60;
              fVar102 = local_2510._12_4_;
              auVar63._12_4_ = fVar102 * fVar60;
              auVar70 = vcmpps_avx(auVar63,local_2520,1);
              fVar60 = (ray->super_RayK<1>).tfar;
              auVar79._0_4_ = fVar67 * fVar60;
              auVar79._4_4_ = fVar68 * fVar60;
              auVar79._8_4_ = fVar69 * fVar60;
              auVar79._12_4_ = fVar102 * fVar60;
              auVar87 = vcmpps_avx(local_2520,auVar79,2);
              auVar70 = vandps_avx(auVar87,auVar70);
              auVar87 = auVar90 & auVar70;
              if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar87[0xf] < '\0') {
                auVar97._0_4_ = (ray->super_RayK<1>).tfar;
                auVar97._4_4_ = (ray->super_RayK<1>).mask;
                auVar97._8_4_ = (ray->super_RayK<1>).id;
                auVar97._12_4_ = (ray->super_RayK<1>).flags;
                auVar90 = vandps_avx(auVar90,auVar70);
                local_24f0 = auVar90;
                local_24b0 = local_2600;
                local_2640 = auVar81._0_8_;
                uStack_2638 = auVar81._8_8_;
                local_24a0 = local_2640;
                uStack_2498 = uStack_2638;
                local_2670 = auVar93._0_8_;
                uStack_2668 = auVar93._8_8_;
                local_2490 = local_2670;
                uStack_2488 = uStack_2668;
                local_2590._0_8_ = context->scene;
                local_25f0 = auVar90;
                auVar70 = vrcpps_avx(local_2510);
                fVar60 = auVar70._0_4_;
                auVar80._0_4_ = fVar67 * fVar60;
                fVar67 = auVar70._4_4_;
                auVar80._4_4_ = fVar68 * fVar67;
                fVar68 = auVar70._8_4_;
                auVar80._8_4_ = fVar69 * fVar68;
                fVar69 = auVar70._12_4_;
                auVar80._12_4_ = fVar102 * fVar69;
                auVar86._8_4_ = 0x3f800000;
                auVar86._0_8_ = 0x3f8000003f800000;
                auVar86._12_4_ = 0x3f800000;
                auVar70 = vsubps_avx(auVar86,auVar80);
                fVar60 = fVar60 + fVar60 * auVar70._0_4_;
                fVar67 = fVar67 + fVar67 * auVar70._4_4_;
                fVar68 = fVar68 + fVar68 * auVar70._8_4_;
                fVar69 = fVar69 + fVar69 * auVar70._12_4_;
                auVar92._0_4_ = fVar60 * local_2520._0_4_;
                auVar92._4_4_ = fVar67 * local_2520._4_4_;
                auVar92._8_4_ = fVar68 * local_2520._8_4_;
                auVar92._12_4_ = fVar69 * local_2520._12_4_;
                local_24c0 = auVar92;
                local_24e0[0] = fVar60 * local_2540._0_4_;
                local_24e0[1] = fVar67 * local_2540._4_4_;
                local_24e0[2] = fVar68 * local_2540._8_4_;
                local_24e0[3] = fVar69 * local_2540._12_4_;
                local_24d0[0] = fVar60 * local_2540._16_4_;
                local_24d0[1] = fVar67 * local_2540._20_4_;
                local_24d0[2] = fVar68 * local_2540._24_4_;
                local_24d0[3] = fVar69 * local_2540._28_4_;
                auVar64._8_4_ = 0x7f800000;
                auVar64._0_8_ = 0x7f8000007f800000;
                auVar64._12_4_ = 0x7f800000;
                auVar70 = vblendvps_avx(auVar64,auVar92,auVar90);
                auVar93 = vshufps_avx(auVar70,auVar70,0xb1);
                auVar93 = vminps_avx(auVar93,auVar70);
                auVar87 = vshufpd_avx(auVar93,auVar93,1);
                auVar93 = vminps_avx(auVar87,auVar93);
                auVar70 = vcmpps_avx(auVar70,auVar93,0);
                auVar93 = auVar90 & auVar70;
                if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar93[0xf] < '\0') {
                  auVar90 = vandps_avx(auVar70,auVar90);
                }
                lVar52 = lVar52 + uVar49;
                local_2640._0_4_ = vextractps_avx(auVar97,1);
                stack0xffffffffffffd9c4 = auVar81._4_12_;
                uVar43 = vmovmskps_avx(auVar90);
                uVar59 = CONCAT44((int)((ulong)context->scene >> 0x20),uVar43);
                piVar46 = (int *)0x0;
                if (uVar59 != 0) {
                  for (; (uVar59 >> (long)piVar46 & 1) == 0; piVar46 = (int *)((long)piVar46 + 1)) {
                  }
                }
                do {
                  local_2600._0_8_ = piVar46;
                  uVar51 = *(uint *)(lVar52 + 0x90 + (long)piVar46 * 4);
                  lVar3 = *(long *)(*(long *)(local_2590._0_8_ + 0x1e8) + (ulong)uVar51 * 8);
                  if ((*(uint *)(lVar3 + 0x34) & local_2640._0_4_) == 0) {
                    *(undefined4 *)(local_25f0 + (long)piVar46 * 4) = 0;
                    uVar51 = local_2640._0_4_;
                  }
                  else {
                    pRVar4 = context->args;
                    local_2640 = (undefined1  [8])pRVar4;
                    if (pRVar4->filter == (RTCFilterFunctionN)0x0) {
                      pRVar47 = context->user;
                      if (*(long *)(lVar3 + 0x40) == 0) {
                        fVar60 = local_24e0[(long)piVar46];
                        fVar67 = local_24d0[(long)piVar46];
                        (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar46 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_24b0 + (long)piVar46 * 4);
                        (ray->Ng).field_0.field_0.y =
                             *(float *)((long)&local_24a0 + (long)piVar46 * 4);
                        (ray->Ng).field_0.field_0.z =
                             *(float *)((long)&local_2490 + (long)piVar46 * 4);
                        ray->u = fVar60;
                        ray->v = fVar67;
                        ray->primID = *(uint *)(lVar52 + 0xa0 + (long)piVar46 * 4);
                        ray->geomID = uVar51;
                        ray->instID[0] = pRVar47->instID[0];
                        ray->instPrimID[0] = pRVar47->instPrimID[0];
                        break;
                      }
                      local_25e0 = auVar97;
                      local_25d0 = auVar92;
                    }
                    else {
                      local_25e0 = auVar97;
                      local_25d0 = auVar92;
                      pRVar47 = context->user;
                    }
                    local_2610._0_8_ = uVar55;
                    local_2580 = *(undefined4 *)(local_24b0 + (long)piVar46 * 4);
                    local_257c = *(undefined4 *)((long)&local_24a0 + (long)piVar46 * 4);
                    local_2578 = *(undefined4 *)((long)&local_2490 + (long)piVar46 * 4);
                    local_2574 = local_24e0[(long)piVar46];
                    local_2570 = local_24d0[(long)piVar46];
                    local_256c = *(undefined4 *)(lVar52 + 0xa0 + (long)piVar46 * 4);
                    local_2568 = uVar51;
                    local_2564 = pRVar47->instID[0];
                    local_2560 = pRVar47->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24c0 + (long)piVar46 * 4);
                    local_2614 = -1;
                    local_25c0.valid = &local_2614;
                    local_25c0.geometryUserPtr = *(void **)(lVar3 + 0x18);
                    local_25c0.context = pRVar47;
                    local_25c0.ray = (RTCRayN *)ray;
                    local_25c0.hit = (RTCHitN *)&local_2580;
                    local_25c0.N = 1;
                    local_25e0 = auVar97;
                    local_25d0 = auVar92;
                    if (((*(code **)(lVar3 + 0x40) == (code *)0x0) ||
                        ((**(code **)(lVar3 + 0x40))(&local_25c0), *local_25c0.valid != 0)) &&
                       ((pRVar4->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar4->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(lVar3 + 0x3e) & 0x40) == 0))
                         || ((*pRVar4->filter)(&local_25c0), *local_25c0.valid != 0)))))) {
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25c0.hit;
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25c0.hit + 4);
                      (((Vec3f *)((long)local_25c0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25c0.hit + 8);
                      *(float *)((long)local_25c0.ray + 0x3c) = *(float *)(local_25c0.hit + 0xc);
                      *(float *)((long)local_25c0.ray + 0x40) = *(float *)(local_25c0.hit + 0x10);
                      *(float *)((long)local_25c0.ray + 0x44) = *(float *)(local_25c0.hit + 0x14);
                      *(float *)((long)local_25c0.ray + 0x48) = *(float *)(local_25c0.hit + 0x18);
                      *(float *)((long)local_25c0.ray + 0x4c) = *(float *)(local_25c0.hit + 0x1c);
                      *(float *)((long)local_25c0.ray + 0x50) = *(float *)(local_25c0.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = (float)local_25e0._0_4_;
                    }
                    *(undefined4 *)(local_25f0 + local_2600._0_8_ * 4) = 0;
                    fVar60 = (ray->super_RayK<1>).tfar;
                    auVar65._4_4_ = fVar60;
                    auVar65._0_4_ = fVar60;
                    auVar65._8_4_ = fVar60;
                    auVar65._12_4_ = fVar60;
                    auVar90 = vcmpps_avx(local_25d0,auVar65,2);
                    local_25f0 = vandps_avx(auVar90,local_25f0);
                    auVar97._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar97._4_4_ = (ray->super_RayK<1>).mask;
                    auVar97._8_4_ = (ray->super_RayK<1>).id;
                    auVar97._12_4_ = (ray->super_RayK<1>).flags;
                    uVar51 = vextractps_avx(auVar97,1);
                    uVar55 = local_2610._0_8_;
                    auVar92 = local_25d0;
                  }
                  local_2640._0_4_ = uVar51;
                  local_25e0 = auVar97;
                  if ((((local_25f0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_25f0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_25f0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_25f0[0xf]) break;
                  local_2610._0_8_ = uVar55;
                  local_25d0 = auVar92;
                  BVHNIntersector1<8,1,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,true>>>
                  ::intersect(&local_25c0);
                  piVar46 = local_25c0.valid;
                  uVar55 = local_2610._0_8_;
                  auVar92 = local_25d0;
                  auVar97 = local_25e0;
                } while( true );
              }
            }
            lVar54 = lVar54 + 1;
          } while (lVar54 != uVar45 - 8);
        }
        fVar60 = (ray->super_RayK<1>).tfar;
        auVar66 = ZEXT3264(CONCAT428(fVar60,CONCAT424(fVar60,CONCAT420(fVar60,CONCAT416(fVar60,
                                                  CONCAT412(fVar60,CONCAT48(fVar60,CONCAT44(fVar60,
                                                  fVar60))))))));
        auVar96 = ZEXT3264(local_23c0);
        auVar99 = ZEXT3264(local_23e0);
        auVar101 = ZEXT3264(local_2400);
        auVar103 = ZEXT3264(local_2420);
        auVar107 = ZEXT3264(local_2440);
        auVar109 = ZEXT3264(local_2460);
        auVar117 = ZEXT3264(local_2480);
      }
    } while (pauVar44 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }